

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglobalstatic.h
# Opt level: O0

Type * __thiscall
QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_socketHandlers>_>::operator()
          (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_socketHandlers>_> *this
          )

{
  bool bVar1;
  undefined8 local_8;
  
  bVar1 = isDestroyed((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_socketHandlers>_>
                       *)0x25a303);
  if (bVar1) {
    local_8 = (Type *)0x0;
  }
  else {
    local_8 = instance();
  }
  return local_8;
}

Assistant:

Type *operator()()
    {
        if (isDestroyed())
            return nullptr;
        return instance();
    }